

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  byte bVar1;
  undefined2 uVar2;
  undefined8 *puVar3;
  long lVar4;
  byte bVar5;
  sign_t sVar6;
  size_t __len;
  size_t __n;
  char __tmp;
  ulong uVar7;
  buffer<char> *c;
  size_t size;
  undefined2 *puVar8;
  ulong uVar9;
  undefined2 *puVar10;
  
  uVar9 = (ulong)(uint)specs->width;
  sVar6 = f->sign;
  uVar7 = 4 - (ulong)(sVar6 == none);
  puVar3 = *(undefined8 **)this;
  lVar4 = puVar3[2];
  __n = uVar9 - uVar7;
  if (uVar9 < uVar7 || __n == 0) {
    uVar7 = uVar7 + lVar4;
    if ((ulong)puVar3[3] < uVar7) {
      (**(code **)*puVar3)(puVar3,uVar7);
      sVar6 = f->sign;
    }
    puVar3[2] = uVar7;
    puVar8 = (undefined2 *)(lVar4 + puVar3[1]);
    if (sVar6 != none) {
      *(undefined1 *)puVar8 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)sVar6);
      puVar8 = (undefined2 *)((long)puVar8 + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(puVar8 + 1) = f->str[2];
    *puVar8 = uVar2;
    return;
  }
  uVar9 = uVar9 + lVar4;
  if ((ulong)puVar3[3] < uVar9) {
    (**(code **)*puVar3)(puVar3,uVar9);
  }
  puVar3[2] = uVar9;
  puVar8 = (undefined2 *)(lVar4 + puVar3[1]);
  bVar1 = (specs->fill).data_[0];
  bVar5 = specs->field_0x9 & 0xf;
  if (bVar5 == 3) {
    uVar7 = __n >> 1 & 0x7fffffff;
    if (1 < __n) {
      memset(puVar8,(uint)bVar1,uVar7);
      puVar8 = (undefined2 *)((long)puVar8 + uVar7);
    }
    if ((ulong)f->sign != 0) {
      *(undefined1 *)puVar8 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar8 = (undefined2 *)((long)puVar8 + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(puVar8 + 1) = f->str[2];
    *puVar8 = uVar2;
    __n = __n - uVar7;
  }
  else {
    if (bVar5 == 2) {
      puVar10 = (undefined2 *)((long)puVar8 + __n);
      memset(puVar8,(uint)bVar1,__n);
      if ((ulong)f->sign != 0) {
        *(undefined1 *)puVar10 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
        puVar10 = (undefined2 *)((long)puVar10 + 1);
      }
      uVar2 = *(undefined2 *)f->str;
      *(char *)(puVar10 + 1) = f->str[2];
      *puVar10 = uVar2;
      return;
    }
    if ((ulong)f->sign != 0) {
      *(undefined1 *)puVar8 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)f->sign);
      puVar8 = (undefined2 *)((long)puVar8 + 1);
    }
    uVar2 = *(undefined2 *)f->str;
    *(char *)(puVar8 + 1) = f->str[2];
    *puVar8 = uVar2;
  }
  memset((undefined1 *)((long)puVar8 + 3),(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }